

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O0

void Qentem::Test::TestLoopTag3(QTest *test)

{
  undefined8 uVar1;
  StringStream<char> *pSVar2;
  undefined1 local_40 [8];
  Value<char> value;
  char *content;
  StringStream<char> ss;
  QTest *test_local;
  
  ss._8_8_ = test;
  StringStream<char>::StringStream((StringStream<char> *)&content);
  JSON::Parse<char>((Value<char> *)local_40,
                    "\n[\n    {\n        \"year\": 2019,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 100\n    },\n    {\n        \"year\": 2019,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 125\n    },\n    {\n        \"year\": 2019,\n        \"quarter\": \"q2\",\n        \"week\": 1,\n        \"total\": 200\n    },\n    {\n        \"year\": 2017,\n        \"quarter\": \"q2\",\n        \"week\": 2,\n        \"total\": 300\n    },\n    {\n        \"year\": 2020,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 400\n    },\n    {\n        \"year\": 2020,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 450\n    },\n    {\n        \"year\": 2020,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 450\n    },\n    {\n        \"year\": 2018,\n        \"quarter\": \"q2\",\n        \"week\": 1,\n        \"total\": 200\n    },\n    {\n        \"year\": 2018,\n        \"quarter\": \"q2\",\n        \"week\": 2,\n        \"total\": 300\n    },\n    {\n        \"year\": 2019,\n        \"quarter\": \"q2\",\n        \"week\": 2,\n        \"total\": 300\n    }\n]\n    "
                   );
  uVar1 = ss._8_8_;
  value._16_8_ = anon_var_dwarf_ec39;
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\'val_1\' group=\'year111\' sort=\'descend\'><loop set=\'val_1\' value=\'val_2\'><loop set=\'val_2\' value=\'val_3\'>{var:val_3}</loop></loop></loop>"
                      ,(Value<char> *)local_40,(StringStream<char> *)&content);
  QTest::IsEqual<Qentem::StringStream<char>,char[1]>
            ((QTest *)uVar1,pSVar2,(char (*) [1])0x137062,0xc99);
  StringStream<char>::Clear((StringStream<char> *)&content);
  uVar1 = ss._8_8_;
  value._16_8_ = anon_var_dwarf_ec51;
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\'val_1\' group=\"year\" sort=\"descend\"><loop set=\"val_1\" value=\"val_2\"><loop set=\"val_2\" value=\"val_3\">{var:val_3}</loop></loop></loop>"
                      ,(Value<char> *)local_40,(StringStream<char> *)&content);
  QTest::IsEqual<Qentem::StringStream<char>,char[61]>
            ((QTest *)uVar1,pSVar2,
             (char (*) [61])"q11400q11450q11450q11100q11125q21200q22300q21200q22300q22300",0xca0);
  StringStream<char>::Clear((StringStream<char> *)&content);
  uVar1 = ss._8_8_;
  value._16_8_ = anon_var_dwarf_ec75;
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"val_1\" group=\'year\' sort=\"descend\"><loop set=\"val_1\" value=\"val_2\" group=\"quarter\" sort=\"ascend\"><loop set=\"val_2\" value=\"val_3\"><loop set=\"val_3\" value=\"val_4\">{var:val_4}</loop></loop></loop></loop>"
                      ,(Value<char> *)local_40,(StringStream<char> *)&content);
  QTest::IsEqual<Qentem::StringStream<char>,char[41]>
            ((QTest *)uVar1,pSVar2,(char (*) [41])"1400145014501100112512002300120023002300",0xca6);
  StringStream<char>::Clear((StringStream<char> *)&content);
  uVar1 = ss._8_8_;
  value._16_8_ = anon_var_dwarf_ec99;
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"val_1\" group=\"year\" sort=\'descend\'>-- {var:val_1}-<loop set=\"val_1\" value=\"val_2\" group=\"quarter\" sort=\"ascend\">{var:val_2}-<loop set=\"val_2\" value=\"val_3\" group=\"week\" sort=\"ascend\">{var:val_3}:<loop set=\"val_3\" value=\"val_4\"><loop set=\"val_4\" value=\"val_5\"> {var:val_5}</loop></loop></loop></loop></loop>"
                      ,(Value<char> *)local_40,(StringStream<char> *)&content);
  QTest::IsEqual<Qentem::StringStream<char>,char[102]>
            ((QTest *)uVar1,pSVar2,
             (char (*) [102])
             "-- 2020-q1-1: 400 450 450-- 2019-q1-1: 100 125q2-1: 2002: 300-- 2018-q2-1: 2002: 300-- 2017-q2-2: 300"
             ,0xcaf);
  StringStream<char>::Clear((StringStream<char> *)&content);
  uVar1 = ss._8_8_;
  value._16_8_ = anon_var_dwarf_eccb;
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"val_1\" group=\"year\">-- {var:val_1}-<loop set=\"val_1\" value=\"val_2\" group=\"quarter\">{var:val_2}-<loop set=\"val_2\" value=\"val_3\" group=\"week\">{var:val_3}:<loop set=\"val_3\" value=\"val_4\"><loop set=\"val_4\" value=\"val_5\"> {var:val_5}</loop></loop></loop></loop></loop>"
                      ,(Value<char> *)local_40,(StringStream<char> *)&content);
  QTest::IsEqual<Qentem::StringStream<char>,char[102]>
            ((QTest *)uVar1,pSVar2,
             (char (*) [102])
             "-- 2019-q1-1: 100 125q2-1: 2002: 300-- 2017-q2-2: 300-- 2020-q1-1: 400 450 450-- 2018-q2-1: 2002: 300"
             ,0xcb8);
  StringStream<char>::Clear((StringStream<char> *)&content);
  Value<char>::Reset((Value<char> *)local_40);
  Value<char>::operator+=((Value<char> *)local_40,4);
  Value<char>::operator+=((Value<char> *)local_40,1);
  Value<char>::operator+=((Value<char> *)local_40,3);
  Value<char>::operator+=((Value<char> *)local_40,5);
  Value<char>::operator+=((Value<char> *)local_40,2);
  Value<char>::operator+=((Value<char> *)local_40,7);
  Value<char>::operator+=((Value<char> *)local_40,6);
  uVar1 = ss._8_8_;
  value._16_8_ = anon_var_dwarf_ecf1;
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"val_1\" sort=\"a\">{var:val_1}</loop>",(Value<char> *)local_40,
                      (StringStream<char> *)&content);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>
            ((QTest *)uVar1,pSVar2,(char (*) [8])"1234567",0xcc9);
  StringStream<char>::Clear((StringStream<char> *)&content);
  uVar1 = ss._8_8_;
  value._16_8_ = anon_var_dwarf_ed09;
  pSVar2 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"val_1\" sort=\"d\">{var:val_1}</loop>",(Value<char> *)local_40,
                      (StringStream<char> *)&content);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>
            ((QTest *)uVar1,pSVar2,(char (*) [8])"7654321",0xcce);
  StringStream<char>::Clear((StringStream<char> *)&content);
  Value<char>::~Value((Value<char> *)local_40);
  StringStream<char>::~StringStream((StringStream<char> *)&content);
  return;
}

Assistant:

static void TestLoopTag3(QTest &test) {
    StringStream<char> ss;
    const char        *content;

    Value<char> value = JSON::Parse(R"(
[
    {
        "year": 2019,
        "quarter": "q1",
        "week": 1,
        "total": 100
    },
    {
        "year": 2019,
        "quarter": "q1",
        "week": 1,
        "total": 125
    },
    {
        "year": 2019,
        "quarter": "q2",
        "week": 1,
        "total": 200
    },
    {
        "year": 2017,
        "quarter": "q2",
        "week": 2,
        "total": 300
    },
    {
        "year": 2020,
        "quarter": "q1",
        "week": 1,
        "total": 400
    },
    {
        "year": 2020,
        "quarter": "q1",
        "week": 1,
        "total": 450
    },
    {
        "year": 2020,
        "quarter": "q1",
        "week": 1,
        "total": 450
    },
    {
        "year": 2018,
        "quarter": "q2",
        "week": 1,
        "total": 200
    },
    {
        "year": 2018,
        "quarter": "q2",
        "week": 2,
        "total": 300
    },
    {
        "year": 2019,
        "quarter": "q2",
        "week": 2,
        "total": 300
    }
]
    )");

    content =
        R"(<loop value='val_1' group='year111' sort='descend'><loop set='val_1' value='val_2'><loop set='val_2' value='val_3'>{var:val_3}</loop></loop></loop>)";

    test.IsEqual(Template::Render(content, value, ss), R"()", __LINE__);
    ss.Clear();

    content =
        R"(<loop value='val_1' group="year" sort="descend"><loop set="val_1" value="val_2"><loop set="val_2" value="val_3">{var:val_3}</loop></loop></loop>)";

    test.IsEqual(Template::Render(content, value, ss),
                 R"(q11400q11450q11450q11100q11125q21200q22300q21200q22300q22300)", __LINE__);
    ss.Clear();

    content =
        R"(<loop value="val_1" group='year' sort="descend"><loop set="val_1" value="val_2" group="quarter" sort="ascend"><loop set="val_2" value="val_3"><loop set="val_3" value="val_4">{var:val_4}</loop></loop></loop></loop>)";

    test.IsEqual(Template::Render(content, value, ss), R"(1400145014501100112512002300120023002300)", __LINE__);
    ss.Clear();

    content =
        R"(<loop value="val_1" group="year" sort='descend'>-- {var:val_1}-<loop set="val_1" value="val_2" group="quarter" sort="ascend">{var:val_2}-<loop set="val_2" value="val_3" group="week" sort="ascend">{var:val_3}:<loop set="val_3" value="val_4"><loop set="val_4" value="val_5"> {var:val_5}</loop></loop></loop></loop></loop>)";

    test.IsEqual(
        Template::Render(content, value, ss),
        R"(-- 2020-q1-1: 400 450 450-- 2019-q1-1: 100 125q2-1: 2002: 300-- 2018-q2-1: 2002: 300-- 2017-q2-2: 300)",
        __LINE__);
    ss.Clear();

    content =
        R"(<loop value="val_1" group="year">-- {var:val_1}-<loop set="val_1" value="val_2" group="quarter">{var:val_2}-<loop set="val_2" value="val_3" group="week">{var:val_3}:<loop set="val_3" value="val_4"><loop set="val_4" value="val_5"> {var:val_5}</loop></loop></loop></loop></loop>)";

    test.IsEqual(
        Template::Render(content, value, ss),
        R"(-- 2019-q1-1: 100 125q2-1: 2002: 300-- 2017-q2-2: 300-- 2020-q1-1: 400 450 450-- 2018-q2-1: 2002: 300)",
        __LINE__);
    ss.Clear();

    ////////////

    value.Reset();

    value += 4;
    value += 1;
    value += 3;
    value += 5;
    value += 2;
    value += 7;
    value += 6;

    content = R"(<loop value="val_1" sort="a">{var:val_1}</loop>)";

    test.IsEqual(Template::Render(content, value, ss), R"(1234567)", __LINE__);
    ss.Clear();

    content = R"(<loop value="val_1" sort="d">{var:val_1}</loop>)";

    test.IsEqual(Template::Render(content, value, ss), R"(7654321)", __LINE__);
    ss.Clear();
}